

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

SynchEvent * absl::GetSynchEvent(void *addr)

{
  SynchEvent *pSVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = synch_event_mu;
  if ((synch_event_mu & 1) == 0) {
    synch_event_mu = synch_event_mu | 1;
    LOCK();
    UNLOCK();
  }
  if ((uVar2 & 1) != 0) {
    base_internal::SpinLock::SlowLock((SpinLock *)&synch_event_mu);
  }
  pSVar1 = *(SynchEvent **)(synch_event + ((long)addr % 0x407 & 0xffffffffU) * 8);
  do {
    if (pSVar1 == (SynchEvent *)0x0) {
LAB_00149931:
      uVar2 = synch_event_mu;
      uVar3 = synch_event_mu & 2;
      LOCK();
      UNLOCK();
      bVar4 = 7 < synch_event_mu;
      synch_event_mu = uVar3;
      if (bVar4) {
        base_internal::SpinLock::SlowUnlock((SpinLock *)&synch_event_mu,uVar2);
      }
      return pSVar1;
    }
    if ((pSVar1->masked_addr ^ (ulong)addr) == 0xf03a5f7bf03a5f7b) {
      pSVar1->refcount = pSVar1->refcount + 1;
      goto LAB_00149931;
    }
    pSVar1 = pSVar1->next;
  } while( true );
}

Assistant:

static SynchEvent *GetSynchEvent(const void *addr) {
  uint32_t h = reinterpret_cast<intptr_t>(addr) % kNSynchEvent;
  SynchEvent *e;
  synch_event_mu.Lock();
  for (e = synch_event[h];
       e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
       e = e->next) {
  }
  if (e != nullptr) {
    e->refcount++;
  }
  synch_event_mu.Unlock();
  return e;
}